

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O2

int Fraig_ManCheckClauseUsingSimInfo(Fraig_Man_t *p,Fraig_Node_t *pNode1,Fraig_Node_t *pNode2)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar5 = (ulong)pNode1 & 0xfffffffffffffffe;
  uVar9 = (ulong)pNode2 & 0xfffffffffffffffe;
  if (uVar5 == uVar9) {
    __assert_fail("pNode1 != pNode2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigMan.c"
                  ,0x1cf,
                  "int Fraig_ManCheckClauseUsingSimInfo(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)"
                 );
  }
  uVar8 = (uint)pNode1 ^ *(uint *)(uVar5 + 0x18);
  uVar6 = (uint)pNode2 ^ *(uint *)(uVar9 + 0x18);
  if (((uVar8 | uVar6) & 1) == 0) {
    uVar7 = 0;
    uVar4 = (ulong)(uint)p->nWordsRand;
    if (p->nWordsRand < 1) {
      uVar4 = uVar7;
    }
    do {
      if (uVar4 == uVar7) {
        uVar7 = 0;
        uVar4 = (ulong)(uint)p->iWordStart;
        if (p->iWordStart < 1) {
          uVar4 = uVar7;
        }
        do {
          if (uVar4 == uVar7) {
            return 1;
          }
          lVar1 = uVar7 * 4;
          lVar2 = uVar7 * 4;
          uVar7 = uVar7 + 1;
        } while ((*(uint *)(*(long *)(uVar9 + 0x70) + lVar1) |
                 *(uint *)(*(long *)(uVar5 + 0x70) + lVar2)) == 0xffffffff);
        return 0;
      }
      lVar1 = uVar7 * 4;
      lVar2 = uVar7 * 4;
      uVar7 = uVar7 + 1;
    } while ((*(uint *)(*(long *)(uVar9 + 0x68) + lVar1) |
             *(uint *)(*(long *)(uVar5 + 0x68) + lVar2)) == 0xffffffff);
  }
  else {
    uVar6 = uVar6 & 1;
    if (((uVar8 & 1) == 0) || (uVar6 != 0)) {
      uVar3 = 0;
      if (0 < p->nWordsRand) {
        uVar3 = p->nWordsRand;
      }
      if (((uVar8 & 1) == 0) && (uVar6 != 0)) {
        uVar4 = 0;
        do {
          if (uVar3 == uVar4) {
            uVar4 = 0;
            uVar7 = (ulong)(uint)p->iWordStart;
            if (p->iWordStart < 1) {
              uVar7 = uVar4;
            }
            do {
              if (uVar7 == uVar4) {
                return 1;
              }
              lVar1 = uVar4 * 4;
              lVar2 = uVar4 * 4;
              uVar4 = uVar4 + 1;
            } while ((*(uint *)(*(long *)(uVar9 + 0x70) + lVar2) &
                     ~*(uint *)(*(long *)(uVar5 + 0x70) + lVar1)) == 0);
            return 0;
          }
          lVar1 = uVar4 * 4;
          lVar2 = uVar4 * 4;
          uVar4 = uVar4 + 1;
        } while ((*(uint *)(*(long *)(uVar9 + 0x68) + lVar2) &
                 ~*(uint *)(*(long *)(uVar5 + 0x68) + lVar1)) == 0);
      }
      else {
        uVar4 = 0;
        do {
          if (uVar3 == uVar4) {
            uVar4 = 0;
            uVar7 = (ulong)(uint)p->iWordStart;
            if (p->iWordStart < 1) {
              uVar7 = uVar4;
            }
            do {
              if (uVar7 == uVar4) {
                return 1;
              }
              lVar1 = uVar4 * 4;
              lVar2 = uVar4 * 4;
              uVar4 = uVar4 + 1;
            } while ((*(uint *)(*(long *)(uVar5 + 0x70) + lVar2) &
                     *(uint *)(*(long *)(uVar9 + 0x70) + lVar1)) == 0);
            return 0;
          }
          lVar1 = uVar4 * 4;
          lVar2 = uVar4 * 4;
          uVar4 = uVar4 + 1;
        } while ((*(uint *)(*(long *)(uVar5 + 0x68) + lVar2) &
                 *(uint *)(*(long *)(uVar9 + 0x68) + lVar1)) == 0);
      }
    }
    else {
      uVar7 = 0;
      uVar4 = (ulong)(uint)p->nWordsRand;
      if (p->nWordsRand < 1) {
        uVar4 = uVar7;
      }
      do {
        if (uVar4 == uVar7) {
          uVar4 = 0;
          uVar7 = (ulong)(uint)p->iWordStart;
          if (p->iWordStart < 1) {
            uVar7 = uVar4;
          }
          do {
            if (uVar7 == uVar4) {
              return 1;
            }
            lVar1 = uVar4 * 4;
            lVar2 = uVar4 * 4;
            uVar4 = uVar4 + 1;
          } while ((*(uint *)(*(long *)(uVar5 + 0x70) + lVar2) &
                   ~*(uint *)(*(long *)(uVar9 + 0x70) + lVar1)) == 0);
          return 0;
        }
        lVar1 = uVar7 * 4;
        lVar2 = uVar7 * 4;
        uVar7 = uVar7 + 1;
      } while ((*(uint *)(*(long *)(uVar5 + 0x68) + lVar2) &
               ~*(uint *)(*(long *)(uVar9 + 0x68) + lVar1)) == 0);
    }
  }
  return 0;
}

Assistant:

int Fraig_ManCheckClauseUsingSimInfo( Fraig_Man_t * p, Fraig_Node_t * pNode1, Fraig_Node_t * pNode2 )
{
    int fCompl1, fCompl2, i;

    fCompl1 = 1 ^ Fraig_IsComplement(pNode1) ^ Fraig_Regular(pNode1)->fInv;
    fCompl2 = 1 ^ Fraig_IsComplement(pNode2) ^ Fraig_Regular(pNode2)->fInv;

    pNode1 = Fraig_Regular(pNode1);
    pNode2 = Fraig_Regular(pNode2);
    assert( pNode1 != pNode2 );
    
    // check the simulation info
    if ( fCompl1 && fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( ~pNode1->puSimR[i] & ~pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( ~pNode1->puSimD[i] & ~pNode2->puSimD[i] )
                return 0;
        return 1;
    }
    if ( !fCompl1 && fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( pNode1->puSimR[i] & ~pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( pNode1->puSimD[i] & ~pNode2->puSimD[i] )
                return 0;
        return 1;
    }
    if ( fCompl1 && !fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( ~pNode1->puSimR[i] & pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( ~pNode1->puSimD[i] & pNode2->puSimD[i] )
                return 0;
        return 1;
    }
//    if ( fCompl1 && fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( pNode1->puSimR[i] & pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( pNode1->puSimD[i] & pNode2->puSimD[i] )
                return 0;
        return 1;
    }
}